

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadU16(BinaryReader *this,uint16_t *out_value,char *desc)

{
  Offset *pOVar1;
  Offset OVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  
  OVar2 = (this->state_).offset;
  if (this->read_end_ < OVar2 + 2) {
    PrintError(this,"unable to read %s: %s","uint16_t",desc,in_R8,in_R9,OVar2);
    return (Result)Error;
  }
  *out_value = *(uint16_t *)((this->state_).data + OVar2);
  pOVar1 = &(this->state_).offset;
  *pOVar1 = *pOVar1 + 2;
  return (Result)Ok;
}

Assistant:

Result BinaryReader::ReadU16(uint16_t* out_value, const char* desc) {
  return ReadT(out_value, "uint16_t", desc);
}